

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

void write_global(mtree_writer *mtree)

{
  uint uVar1;
  uint uVar2;
  att_counter_set *paVar3;
  uint local_54;
  int effkeys;
  int oldkeys;
  int keys;
  att_counter_set *acs;
  archive_string unsetstr;
  archive_string setstr;
  mtree_writer *mtree_local;
  
  unsetstr.buffer_length = 0;
  acs = (att_counter_set *)0x0;
  unsetstr.s = (char *)0x0;
  unsetstr.length = 0;
  uVar1 = mtree->keys;
  local_54 = uVar1 & 0x380238;
  uVar2 = (mtree->set).keys;
  paVar3 = &mtree->acs;
  effkeys = local_54;
  if ((mtree->set).processing == 0) {
    if (paVar3->uid_list == (attr_counter *)0x0) {
      effkeys = uVar1 & 0x80238;
    }
    if ((mtree->acs).gid_list == (attr_counter *)0x0) {
      effkeys = effkeys & 0xffffffcf;
    }
    if ((mtree->acs).mode_list == (attr_counter *)0x0) {
      effkeys = effkeys & 0xfffffdff;
    }
    if ((mtree->acs).flags_list == (attr_counter *)0x0) {
      effkeys = effkeys & 0xfffffff7;
    }
  }
  else {
    local_54 = uVar1 & 0x300238;
    if (paVar3->uid_list == (attr_counter *)0x0) {
      local_54 = uVar1 & 0x238;
    }
    else if (((uVar2 & 0x300000) != 0) &&
            ((paVar3->uid_list->count < 2 || ((mtree->set).uid == paVar3->uid_list->m_entry->uid))))
    {
      local_54 = uVar1 & 0x238;
    }
    if ((mtree->acs).gid_list == (attr_counter *)0x0) {
      local_54 = local_54 & 0xffffffcf;
    }
    else if (((uVar2 & 0x30) != 0) &&
            ((((mtree->acs).gid_list)->count < 2 ||
             ((mtree->set).gid == ((mtree->acs).gid_list)->m_entry->gid)))) {
      local_54 = local_54 & 0xffffffcf;
    }
    if ((mtree->acs).mode_list == (attr_counter *)0x0) {
      local_54 = local_54 & 0xfffffdff;
    }
    else if (((uVar2 & 0x200) != 0) &&
            ((((mtree->acs).mode_list)->count < 2 ||
             ((mtree->set).mode == ((mtree->acs).mode_list)->m_entry->mode)))) {
      local_54 = local_54 & 0xfffffdff;
    }
    if ((mtree->acs).flags_list == (attr_counter *)0x0) {
      local_54 = local_54 & 0xfffffff7;
    }
    else if (((uVar2 & 8) != 0) &&
            ((((mtree->acs).flags_list)->count < 2 ||
             ((((mtree->acs).flags_list)->m_entry->fflags_set == (mtree->set).fflags_set &&
              (((mtree->acs).flags_list)->m_entry->fflags_clear == (mtree->set).fflags_clear)))))) {
      local_54 = local_54 & 0xfffffff7;
    }
  }
  if ((effkeys & local_54 & 0x80000) != 0) {
    if (mtree->dironly == 0) {
      archive_strcat((archive_string *)&unsetstr.buffer_length," type=file");
      (mtree->set).type = 0x8000;
    }
    else {
      archive_strcat((archive_string *)&unsetstr.buffer_length," type=dir");
      (mtree->set).type = 0x4000;
    }
  }
  if ((effkeys & local_54 & 0x200000) != 0) {
    if ((paVar3->uid_list->m_entry->uname).length == 0) {
      effkeys = effkeys & 0xffdfffff;
      if ((uVar2 & 0x200000) != 0) {
        archive_strcat((archive_string *)&acs," uname");
      }
    }
    else {
      archive_strcat((archive_string *)&unsetstr.buffer_length," uname=");
      mtree_quote((archive_string *)&unsetstr.buffer_length,(paVar3->uid_list->m_entry->uname).s);
    }
  }
  if ((effkeys & local_54 & 0x100000) != 0) {
    (mtree->set).uid = paVar3->uid_list->m_entry->uid;
    archive_string_sprintf((archive_string *)&unsetstr.buffer_length," uid=%jd",(mtree->set).uid);
  }
  if ((effkeys & local_54 & 0x20) != 0) {
    if ((((mtree->acs).gid_list)->m_entry->gname).length == 0) {
      effkeys = effkeys & 0xffffffdf;
      if ((uVar2 & 0x20) != 0) {
        archive_strcat((archive_string *)&acs," gname");
      }
    }
    else {
      archive_strcat((archive_string *)&unsetstr.buffer_length," gname=");
      mtree_quote((archive_string *)&unsetstr.buffer_length,
                  (((mtree->acs).gid_list)->m_entry->gname).s);
    }
  }
  if ((effkeys & local_54 & 0x10) != 0) {
    (mtree->set).gid = ((mtree->acs).gid_list)->m_entry->gid;
    archive_string_sprintf((archive_string *)&unsetstr.buffer_length," gid=%jd",(mtree->set).gid);
  }
  if ((effkeys & local_54 & 0x200) != 0) {
    (mtree->set).mode = ((mtree->acs).mode_list)->m_entry->mode;
    archive_string_sprintf
              ((archive_string *)&unsetstr.buffer_length," mode=%o",(ulong)(mtree->set).mode);
  }
  if ((effkeys & local_54 & 8) != 0) {
    if ((((mtree->acs).flags_list)->m_entry->fflags_text).length == 0) {
      effkeys = effkeys & 0xfffffff7;
      if ((uVar2 & 8) != 0) {
        archive_strcat((archive_string *)&acs," flags");
      }
    }
    else {
      archive_strcat((archive_string *)&unsetstr.buffer_length," flags=");
      mtree_quote((archive_string *)&unsetstr.buffer_length,
                  (((mtree->acs).flags_list)->m_entry->fflags_text).s);
      (mtree->set).fflags_set = ((mtree->acs).flags_list)->m_entry->fflags_set;
      (mtree->set).fflags_clear = ((mtree->acs).flags_list)->m_entry->fflags_clear;
    }
  }
  if (unsetstr.s != (char *)0x0) {
    archive_string_sprintf(&mtree->buf,"/unset%s\n",acs);
  }
  archive_string_free((archive_string *)&acs);
  archive_string_free((archive_string *)&unsetstr.buffer_length);
  (mtree->set).keys = effkeys;
  (mtree->set).processing = 1;
  return;
}

Assistant:

static void
write_global(struct mtree_writer *mtree)
{
	struct archive_string setstr;
	struct archive_string unsetstr;
	struct att_counter_set *acs;
	int keys, oldkeys, effkeys;

	archive_string_init(&setstr);
	archive_string_init(&unsetstr);
	keys = mtree->keys & SET_KEYS;
	oldkeys = mtree->set.keys;
	effkeys = keys;
	acs = &mtree->acs;
	if (mtree->set.processing) {
		/*
		 * Check if the global data needs updating.
		 */
		effkeys &= ~F_TYPE;
		if (acs->uid_list == NULL)
			effkeys &= ~(F_UNAME | F_UID);
		else if (oldkeys & (F_UNAME | F_UID)) {
			if (acs->uid_list->count < 2 ||
			    mtree->set.uid == acs->uid_list->m_entry->uid)
				effkeys &= ~(F_UNAME | F_UID);
		}
		if (acs->gid_list == NULL)
			effkeys &= ~(F_GNAME | F_GID);
		else if (oldkeys & (F_GNAME | F_GID)) {
			if (acs->gid_list->count < 2 ||
			    mtree->set.gid == acs->gid_list->m_entry->gid)
				effkeys &= ~(F_GNAME | F_GID);
		}
		if (acs->mode_list == NULL)
			effkeys &= ~F_MODE;
		else if (oldkeys & F_MODE) {
			if (acs->mode_list->count < 2 ||
			    mtree->set.mode == acs->mode_list->m_entry->mode)
				effkeys &= ~F_MODE;
		}
		if (acs->flags_list == NULL)
			effkeys &= ~F_FLAGS;
		else if ((oldkeys & F_FLAGS) != 0) {
			if (acs->flags_list->count < 2 ||
			    (acs->flags_list->m_entry->fflags_set ==
				mtree->set.fflags_set &&
			     acs->flags_list->m_entry->fflags_clear ==
				mtree->set.fflags_clear))
				effkeys &= ~F_FLAGS;
		}
	} else {
		if (acs->uid_list == NULL)
			keys &= ~(F_UNAME | F_UID);
		if (acs->gid_list == NULL)
			keys &= ~(F_GNAME | F_GID);
		if (acs->mode_list == NULL)
			keys &= ~F_MODE;
		if (acs->flags_list == NULL)
			keys &= ~F_FLAGS;
	}
	if ((keys & effkeys & F_TYPE) != 0) {
		if (mtree->dironly) {
			archive_strcat(&setstr, " type=dir");
			mtree->set.type = AE_IFDIR;
		} else {
			archive_strcat(&setstr, " type=file");
			mtree->set.type = AE_IFREG;
		}
	}
	if ((keys & effkeys & F_UNAME) != 0) {
		if (archive_strlen(&(acs->uid_list->m_entry->uname)) > 0) {
			archive_strcat(&setstr, " uname=");
			mtree_quote(&setstr, acs->uid_list->m_entry->uname.s);
		} else {
			keys &= ~F_UNAME;
			if ((oldkeys & F_UNAME) != 0)
				archive_strcat(&unsetstr, " uname");
		}
	}
	if ((keys & effkeys & F_UID) != 0) {
		mtree->set.uid = acs->uid_list->m_entry->uid;
		archive_string_sprintf(&setstr, " uid=%jd",
		    (intmax_t)mtree->set.uid);
	}
	if ((keys & effkeys & F_GNAME) != 0) {
		if (archive_strlen(&(acs->gid_list->m_entry->gname)) > 0) {
			archive_strcat(&setstr, " gname=");
			mtree_quote(&setstr, acs->gid_list->m_entry->gname.s);
		} else {
			keys &= ~F_GNAME;
			if ((oldkeys & F_GNAME) != 0)
				archive_strcat(&unsetstr, " gname");
		}
	}
	if ((keys & effkeys & F_GID) != 0) {
		mtree->set.gid = acs->gid_list->m_entry->gid;
		archive_string_sprintf(&setstr, " gid=%jd",
		    (intmax_t)mtree->set.gid);
	}
	if ((keys & effkeys & F_MODE) != 0) {
		mtree->set.mode = acs->mode_list->m_entry->mode;
		archive_string_sprintf(&setstr, " mode=%o",
		    (unsigned int)mtree->set.mode);
	}
	if ((keys & effkeys & F_FLAGS) != 0) {
		if (archive_strlen(
		    &(acs->flags_list->m_entry->fflags_text)) > 0) {
			archive_strcat(&setstr, " flags=");
			mtree_quote(&setstr,
			    acs->flags_list->m_entry->fflags_text.s);
			mtree->set.fflags_set =
			    acs->flags_list->m_entry->fflags_set;
			mtree->set.fflags_clear =
			    acs->flags_list->m_entry->fflags_clear;
		} else {
			keys &= ~F_FLAGS;
			if ((oldkeys & F_FLAGS) != 0)
				archive_strcat(&unsetstr, " flags");
		}
	}
	if (unsetstr.length > 0)
		archive_string_sprintf(&mtree->buf, "/unset%s\n", unsetstr.s);
	archive_string_free(&unsetstr);
	if (setstr.length > 0)
		archive_string_sprintf(&mtree->buf, "/set%s\n", setstr.s);
	archive_string_free(&setstr);
	mtree->set.keys = keys;
	mtree->set.processing = 1;
}